

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall httplib::Server::read_content(Server *this,Stream *strm,Request *req,Response *res)

{
  iterator res_00;
  bool bVar1;
  long lVar2;
  ulong uVar3;
  string local_f0;
  string *local_d0;
  string *content_type;
  anon_class_8_1_ba1d3da0 local_b8;
  ContentReceiver local_b0;
  anon_class_16_2_4418a647 local_90;
  MultipartContentHeader local_80;
  anon_class_8_1_ba1d73fe local_60;
  ContentReceiver local_58;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::MultipartFormData>_>
  local_38;
  iterator cur;
  Response *res_local;
  Request *req_local;
  Stream *strm_local;
  Server *this_local;
  
  cur._M_node = (_Base_ptr)res;
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::MultipartFormData>_>
  ::_Rb_tree_iterator(&local_38);
  res_00._M_node = cur._M_node;
  local_60.req = req;
  std::function<bool(char_const*,unsigned_long)>::
  function<httplib::Server::read_content(httplib::Stream&,httplib::Request&,httplib::Response&)::_lambda(char_const*,unsigned_long)_1_,void>
            ((function<bool(char_const*,unsigned_long)> *)&local_58,&local_60);
  local_90.cur = &local_38;
  local_90.req = req;
  std::function<bool(httplib::MultipartFormData_const&)>::
  function<httplib::Server::read_content(httplib::Stream&,httplib::Request&,httplib::Response&)::_lambda(httplib::MultipartFormData_const&)_1_,void>
            ((function<bool(httplib::MultipartFormData_const&)> *)&local_80,&local_90);
  local_b8.cur = &local_38;
  std::function<bool(char_const*,unsigned_long)>::
  function<httplib::Server::read_content(httplib::Stream&,httplib::Request&,httplib::Response&)::_lambda(char_const*,unsigned_long)_2_,void>
            ((function<bool(char_const*,unsigned_long)> *)&local_b0,&local_b8);
  bVar1 = read_content_core(this,strm,req,(Response *)res_00._M_node,&local_58,&local_80,&local_b0);
  std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_b0);
  std::function<bool_(const_httplib::MultipartFormData_&)>::~function(&local_80);
  std::function<bool_(const_char_*,_unsigned_long)>::~function(&local_58);
  if (!bVar1) {
    return false;
  }
  Request::get_header_value_abi_cxx11_(&local_f0,req,"Content-Type",0);
  local_d0 = &local_f0;
  lVar2 = std::__cxx11::string::find((char *)local_d0,0x1c2f39);
  if (lVar2 == 0) {
    uVar3 = std::__cxx11::string::size();
    if (0x2000 < uVar3) {
      cur._M_node[1]._M_color = 0x19d;
      this_local._7_1_ = false;
      goto LAB_001a9baa;
    }
    detail::parse_query_text(&req->body,&req->params);
  }
  this_local._7_1_ = true;
LAB_001a9baa:
  std::__cxx11::string::~string((string *)&local_f0);
  return this_local._7_1_;
}

Assistant:

inline bool Server::read_content(Stream &strm, Request &req, Response &res) {
  MultipartFormDataMap::iterator cur;
  if (read_content_core(
          strm, req, res,
          // Regular
          [&](const char *buf, size_t n) {
            if (req.body.size() + n > req.body.max_size()) { return false; }
            req.body.append(buf, n);
            return true;
          },
          // Multipart
          [&](const MultipartFormData &file) {
            cur = req.files.emplace(file.name, file);
            return true;
          },
          [&](const char *buf, size_t n) {
            auto &content = cur->second.content;
            if (content.size() + n > content.max_size()) { return false; }
            content.append(buf, n);
            return true;
          })) {
    const auto &content_type = req.get_header_value("Content-Type");
    if (!content_type.find("application/x-www-form-urlencoded")) {
      if (req.body.size() > CPPHTTPLIB_REQUEST_URI_MAX_LENGTH) {
        res.status = 413; // NOTE: should be 414?
        return false;
      }
      detail::parse_query_text(req.body, req.params);
    }
    return true;
  }
  return false;
}